

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::DiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  RTCIntersectArguments *pRVar12;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar21;
  float fVar22;
  undefined1 auVar19 [16];
  float fVar23;
  undefined1 auVar20 [16];
  float fVar24;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  float fVar30;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  vbool<4> valid;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  DiscIntersectorHitM<4> hit;
  int local_13c;
  undefined1 local_138 [16];
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  RTCFilterFunctionNArguments local_f8;
  undefined1 local_c8 [16];
  float local_b8 [8];
  undefined1 local_98 [16];
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar13;
  undefined1 auVar26 [64];
  
  pSVar6 = context->scene;
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  lVar14 = *(long *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar37 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar15 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar35 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar36 = *(undefined1 (*) [16])(lVar14 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar17 = vunpcklps_avx(auVar37,auVar35);
  auVar20 = vunpckhps_avx(auVar37,auVar35);
  auVar37 = vunpcklps_avx(auVar15,auVar36);
  auVar39 = vunpckhps_avx(auVar15,auVar36);
  auVar36 = vunpcklps_avx(auVar17,auVar37);
  auVar15 = vunpckhps_avx(auVar17,auVar37);
  auVar37 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar35 = vpcmpgtd_avx(auVar37,_DAT_01f4ad30);
  auVar37 = vunpcklps_avx(auVar20,auVar39);
  local_48 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar11 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar19._4_4_ = uVar11;
  auVar19._0_4_ = uVar11;
  auVar19._8_4_ = uVar11;
  auVar19._12_4_ = uVar11;
  auVar36 = vsubps_avx(auVar36,auVar19);
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar17._4_4_ = uVar11;
  auVar17._0_4_ = uVar11;
  auVar17._8_4_ = uVar11;
  auVar17._12_4_ = uVar11;
  auVar17 = vsubps_avx(auVar15,auVar17);
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar15._4_4_ = uVar11;
  auVar15._0_4_ = uVar11;
  auVar15._8_4_ = uVar11;
  auVar15._12_4_ = uVar11;
  auVar19 = vsubps_avx(auVar37,auVar15);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar41 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar18 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar21 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar37 = ZEXT416((uint)(fVar18 * fVar18 + fVar21 * fVar21 + fVar41 * fVar41));
  auVar15 = vshufps_avx(auVar37,auVar37,0);
  auVar37 = vrcpps_avx(auVar15);
  fVar41 = auVar37._0_4_;
  auVar38._0_4_ = fVar41 * auVar15._0_4_;
  fVar44 = auVar37._4_4_;
  auVar38._4_4_ = fVar44 * auVar15._4_4_;
  fVar45 = auVar37._8_4_;
  auVar38._8_4_ = fVar45 * auVar15._8_4_;
  fVar46 = auVar37._12_4_;
  auVar38._12_4_ = fVar46 * auVar15._12_4_;
  auVar47._8_4_ = 0x3f800000;
  auVar47._0_8_ = 0x3f8000003f800000;
  auVar47._12_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar47,auVar38);
  fVar30 = auVar19._0_4_;
  fVar32 = auVar19._4_4_;
  fVar33 = auVar19._8_4_;
  fVar34 = auVar19._12_4_;
  fVar24 = auVar17._0_4_;
  fVar27 = auVar17._4_4_;
  fVar28 = auVar17._8_4_;
  fVar29 = auVar17._12_4_;
  fVar18 = auVar36._0_4_;
  fVar21 = auVar36._4_4_;
  fVar22 = auVar36._8_4_;
  fVar23 = auVar36._12_4_;
  local_98._0_4_ =
       (fVar18 * fVar1 + fVar24 * fVar2 + fVar30 * fVar3) * (fVar41 + fVar41 * auVar37._0_4_);
  local_98._4_4_ =
       (fVar21 * fVar1 + fVar27 * fVar2 + fVar32 * fVar3) * (fVar44 + fVar44 * auVar37._4_4_);
  local_98._8_4_ =
       (fVar22 * fVar1 + fVar28 * fVar2 + fVar33 * fVar3) * (fVar45 + fVar45 * auVar37._8_4_);
  local_98._12_4_ =
       (fVar23 * fVar1 + fVar29 * fVar2 + fVar34 * fVar3) * (fVar46 + fVar46 * auVar37._12_4_);
  auVar48 = ZEXT1664(local_98);
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar37._4_4_ = uVar11;
  auVar37._0_4_ = uVar11;
  auVar37._8_4_ = uVar11;
  auVar37._12_4_ = uVar11;
  auVar37 = vcmpps_avx(auVar37,local_98,2);
  fVar41 = (ray->super_RayK<1>).tfar;
  auVar42._4_4_ = fVar41;
  auVar42._0_4_ = fVar41;
  auVar42._8_4_ = fVar41;
  auVar42._12_4_ = fVar41;
  auVar15 = vcmpps_avx(local_98,auVar42,2);
  auVar37 = vandps_avx(auVar15,auVar37);
  auVar15 = auVar35 & auVar37;
  if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar15[0xf] < '\0') {
    auVar37 = vandps_avx(auVar37,auVar35);
    auVar20 = vunpckhps_avx(auVar20,auVar39);
    auVar35._0_4_ = local_98._0_4_ * fVar1;
    auVar35._4_4_ = local_98._4_4_ * fVar1;
    auVar35._8_4_ = local_98._8_4_ * fVar1;
    auVar35._12_4_ = local_98._12_4_ * fVar1;
    auVar39._0_4_ = local_98._0_4_ * fVar2;
    auVar39._4_4_ = local_98._4_4_ * fVar2;
    auVar39._8_4_ = local_98._8_4_ * fVar2;
    auVar39._12_4_ = local_98._12_4_ * fVar2;
    auVar43._0_4_ = local_98._0_4_ * fVar3;
    auVar43._4_4_ = local_98._4_4_ * fVar3;
    auVar43._8_4_ = local_98._8_4_ * fVar3;
    auVar43._12_4_ = local_98._12_4_ * fVar3;
    auVar15 = vsubps_avx(auVar36,auVar35);
    auVar35 = vsubps_avx(auVar17,auVar39);
    auVar36 = vsubps_avx(auVar19,auVar43);
    auVar40._0_4_ =
         auVar35._0_4_ * auVar35._0_4_ + auVar36._0_4_ * auVar36._0_4_ +
         auVar15._0_4_ * auVar15._0_4_;
    auVar40._4_4_ =
         auVar35._4_4_ * auVar35._4_4_ + auVar36._4_4_ * auVar36._4_4_ +
         auVar15._4_4_ * auVar15._4_4_;
    auVar40._8_4_ =
         auVar35._8_4_ * auVar35._8_4_ + auVar36._8_4_ * auVar36._8_4_ +
         auVar15._8_4_ * auVar15._8_4_;
    auVar40._12_4_ =
         auVar35._12_4_ * auVar35._12_4_ + auVar36._12_4_ * auVar36._12_4_ +
         auVar15._12_4_ * auVar15._12_4_;
    auVar36._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar36._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar36._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar36._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar15 = vcmpps_avx(auVar40,auVar36,2);
    auVar35 = auVar37 & auVar15;
    if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0')
    {
      auVar37 = vandps_avx(auVar37,auVar15);
      auVar20._0_4_ = fVar18 * fVar18 + fVar24 * fVar24 + fVar30 * fVar30;
      auVar20._4_4_ = fVar21 * fVar21 + fVar27 * fVar27 + fVar32 * fVar32;
      auVar20._8_4_ = fVar22 * fVar22 + fVar28 * fVar28 + fVar33 * fVar33;
      auVar20._12_4_ = fVar23 * fVar23 + fVar29 * fVar29 + fVar34 * fVar34;
      auVar15 = vcmpps_avx(auVar20,auVar36,6);
      auVar35 = auVar15 & auVar37;
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        auVar4._0_4_ = (ray->super_RayK<1>).tfar;
        auVar4._4_4_ = (ray->super_RayK<1>).mask;
        auVar4._8_4_ = (ray->super_RayK<1>).id;
        auVar4._12_4_ = (ray->super_RayK<1>).flags;
        auVar31 = ZEXT1664(auVar4);
        auVar37 = vandps_avx(auVar37,auVar15);
        local_b8[0] = 0.0;
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[3] = 0.0;
        local_b8[4] = 0.0;
        local_b8[5] = 0.0;
        local_b8[6] = 0.0;
        local_b8[7] = 0.0;
        local_88[0] = -fVar1;
        local_88[1] = -fVar1;
        local_88[2] = -fVar1;
        local_88[3] = -fVar1;
        local_78[0] = -fVar2;
        local_78[1] = -fVar2;
        local_78[2] = -fVar2;
        local_78[3] = -fVar2;
        local_68[0] = -fVar3;
        local_68[1] = -fVar3;
        local_68[2] = -fVar3;
        local_68[3] = -fVar3;
        local_138 = auVar37;
        auVar25._8_4_ = 0x7f800000;
        auVar25._0_8_ = 0x7f8000007f800000;
        auVar25._12_4_ = 0x7f800000;
        auVar26 = ZEXT1664(auVar25);
        auVar15 = vblendvps_avx(auVar25,local_98,auVar37);
        auVar35 = vshufps_avx(auVar15,auVar15,0xb1);
        auVar35 = vminps_avx(auVar35,auVar15);
        auVar36 = vshufpd_avx(auVar35,auVar35,1);
        auVar35 = vminps_avx(auVar36,auVar35);
        auVar15 = vcmpps_avx(auVar15,auVar35,0);
        auVar35 = auVar37 & auVar15;
        if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar35[0xf] < '\0') {
          auVar37 = vandps_avx(auVar15,auVar37);
        }
        uVar9 = vextractps_avx(auVar4,1);
        uVar10 = vmovmskps_avx(auVar37);
        lVar14 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        do {
          local_110 = *(uint *)(local_48 + lVar14 * 4);
          pRVar12 = (RTCIntersectArguments *)(ulong)local_110;
          pGVar7 = (pSVar6->geometries).items[(long)pRVar12].ptr;
          if ((pGVar7->mask & uVar9) == 0) {
            *(undefined4 *)(local_138 + lVar14 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar1 = local_b8[lVar14];
              fVar2 = local_b8[lVar14 + 4];
              (ray->super_RayK<1>).tfar = local_88[lVar14 + -4];
              (ray->Ng).field_0.field_0.x = local_88[lVar14];
              (ray->Ng).field_0.field_0.y = local_78[lVar14];
              (ray->Ng).field_0.field_0.z = local_68[lVar14];
              ray->u = fVar1;
              ray->v = fVar2;
              ray->primID = (Disc->primIDs).field_0.i[lVar14];
              ray->geomID = local_110;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            local_58 = auVar31._0_16_;
            local_c8 = auVar48._0_16_;
            local_128 = local_88[lVar14];
            local_124 = local_78[lVar14];
            local_120 = local_68[lVar14];
            local_11c = local_b8[lVar14];
            local_118 = local_b8[lVar14 + 4];
            local_114 = (Disc->primIDs).field_0.i[lVar14];
            pRVar12 = (RTCIntersectArguments *)0x0;
            local_10c = context->user->instID[0];
            local_108 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = local_88[lVar14 + -4];
            local_13c = -1;
            local_f8.valid = &local_13c;
            local_f8.geometryUserPtr = pGVar7->userPtr;
            local_f8.context = context->user;
            local_f8.ray = (RTCRayN *)ray;
            local_f8.hit = (RTCHitN *)&local_128;
            local_f8.N = 1;
            if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar7->intersectionFilterN)(&local_f8), *local_f8.valid != 0)) {
              pRVar12 = context->args;
              if ((pRVar12->filter != (RTCFilterFunctionN)0x0) &&
                 ((((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                    RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)) &&
                  ((*pRVar12->filter)(&local_f8), *local_f8.valid == 0)))) goto LAB_00763074;
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.x = *(float *)local_f8.hit;
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_f8.hit + 4);
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_f8.hit + 8);
              *(float *)((long)local_f8.ray + 0x3c) = *(float *)(local_f8.hit + 0xc);
              *(float *)((long)local_f8.ray + 0x40) = *(float *)(local_f8.hit + 0x10);
              *(float *)((long)local_f8.ray + 0x44) = *(float *)(local_f8.hit + 0x14);
              *(float *)((long)local_f8.ray + 0x48) = *(float *)(local_f8.hit + 0x18);
              *(float *)((long)local_f8.ray + 0x4c) = *(float *)(local_f8.hit + 0x1c);
              pRVar12 = (RTCIntersectArguments *)0x0;
              *(float *)((long)local_f8.ray + 0x50) = *(float *)(local_f8.hit + 0x20);
            }
            else {
LAB_00763074:
              (ray->super_RayK<1>).tfar = (float)local_58._0_4_;
            }
            auVar48 = ZEXT1664(local_c8);
            auVar26 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            *(undefined4 *)(local_138 + lVar14 * 4) = 0;
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar16._4_4_ = fVar1;
            auVar16._0_4_ = fVar1;
            auVar16._8_4_ = fVar1;
            auVar16._12_4_ = fVar1;
            auVar37 = vcmpps_avx(local_c8,auVar16,2);
            local_138 = vandps_avx(auVar37,local_138);
            auVar5._0_4_ = (ray->super_RayK<1>).tfar;
            auVar5._4_4_ = (ray->super_RayK<1>).mask;
            auVar5._8_4_ = (ray->super_RayK<1>).id;
            auVar5._12_4_ = (ray->super_RayK<1>).flags;
            auVar31 = ZEXT1664(auVar5);
            uVar9 = vextractps_avx(auVar5,1);
          }
          if ((((local_138 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_138 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_138 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_138[0xf]) {
            return;
          }
          auVar37 = vblendvps_avx(auVar26._0_16_,auVar48._0_16_,local_138);
          auVar15 = vshufps_avx(auVar37,auVar37,0xb1);
          auVar15 = vminps_avx(auVar15,auVar37);
          auVar35 = vshufpd_avx(auVar15,auVar15,1);
          auVar15 = vminps_avx(auVar35,auVar15);
          auVar15 = vcmpps_avx(auVar37,auVar15,0);
          auVar35 = local_138 & auVar15;
          auVar37 = local_138;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            auVar37 = vandps_avx(auVar15,local_138);
          }
          uVar11 = vmovmskps_avx(auVar37);
          uVar13 = CONCAT44((int)((ulong)pRVar12 >> 0x20),uVar11);
          lVar14 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }